

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_2_expr.h
# Opt level: O0

void __thiscall
mp::
Constraints2Expr<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>>
::ConvertConditionalConLHS<mp::LinTerms,mp::AlgConRhs<_1>>
          (Constraints2Expr<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
           *this,ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>_>
                 *con,int i)

{
  initializer_list<double> __l;
  initializer_list<int> __l_00;
  bool bVar1;
  int iVar2;
  ConType *pCVar3;
  FunctionalConstraint *in_RSI;
  long in_RDI;
  ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>_> ccnew;
  LinTerms lt;
  Var resvar;
  LinearFunctionalConstraint fc;
  AutoLinkScope<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  alscope;
  AffineExpr *in_stack_fffffffffffffae8;
  undefined4 in_stack_fffffffffffffaf0;
  undefined4 in_stack_fffffffffffffaf4;
  LinTerms *in_stack_fffffffffffffaf8;
  AlgebraicExpression<mp::LinTerms> *in_stack_fffffffffffffb00;
  int var;
  undefined8 in_stack_fffffffffffffb08;
  undefined1 fSort;
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *this_00;
  LinearFunctionalConstraint *in_stack_fffffffffffffb10;
  Context ctx;
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *in_stack_fffffffffffffb18;
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_> *this_01;
  AlgConRhs<_1> rr;
  iterator pdVar4;
  undefined1 *puVar5;
  undefined4 in_stack_fffffffffffffb58;
  undefined4 in_stack_fffffffffffffb5c;
  LinTerms *in_stack_fffffffffffffb60;
  Arguments *in_stack_fffffffffffffb88;
  ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>_>
  *in_stack_fffffffffffffb90;
  AutoLinkScope<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  *in_stack_fffffffffffffbe0;
  ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>_>
  *in_stack_fffffffffffffc30;
  int in_stack_fffffffffffffc3c;
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *in_stack_fffffffffffffc40;
  undefined1 local_380 [212];
  Var local_2ac;
  _Bit_pointer local_2a8;
  _Bit_type *local_2a0;
  undefined1 local_279 [169];
  Var local_1d0;
  undefined1 local_1c0 [120];
  double local_148 [39];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_10;
  
  local_10._M_allocated_capacity = (size_type)in_RSI;
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
  ::
  MakeAutoLinker<mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRhs<_1>>>>
            (in_stack_fffffffffffffb18,
             (ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>_> *)
             in_stack_fffffffffffffb10,(int)((ulong)in_stack_fffffffffffffb08 >> 0x20));
  fSort = (undefined1)((ulong)in_stack_fffffffffffffb08 >> 0x38);
  pCVar3 = ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<-1>_>_>::
           GetConstraint((ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>_>
                          *)0x244c8b);
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<-1>_>::GetArguments
            ((AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_> *)0x244c9c);
  LinTerms::LinTerms(&in_stack_fffffffffffffb00->super_LinTerms,in_stack_fffffffffffffaf8);
  pdVar4 = local_148;
  puVar5 = local_1c0;
  AlgebraicExpression<mp::LinTerms>::AlgebraicExpression
            (in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8,
             (double)CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0));
  MakeFunctionalConstraint(in_stack_fffffffffffffae8);
  AlgebraicExpression<mp::LinTerms>::~AlgebraicExpression
            ((AlgebraicExpression<mp::LinTerms> *)0x244cf1);
  LinTerms::~LinTerms((LinTerms *)CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0));
  local_1d0 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
              ::AssignResultVar2Args<mp::LinearFunctionalConstraint>
                        (in_stack_fffffffffffffb18,in_stack_fffffffffffffb10);
  bVar1 = FlatModel<mp::DefaultFlatModelParams>::VarHasMarking
                    ((FlatModel<mp::DefaultFlatModelParams> *)
                     CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0),
                     (int)((ulong)in_stack_fffffffffffffae8 >> 0x20));
  if (!bVar1) {
    FlatModel<mp::DefaultFlatModelParams>::MarkAsExpression
              ((FlatModel<mp::DefaultFlatModelParams> *)
               CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0),
               (int)((ulong)in_stack_fffffffffffffae8 >> 0x20));
  }
  local_279._1_8_ = (pointer)0x3ff0000000000000;
  local_279._9_8_ = local_279 + 1;
  local_279._17_8_ = (pointer)0x1;
  rr.rhs_ = (double)local_279;
  std::allocator<double>::allocator((allocator<double> *)0x244dcc);
  __l._M_len = (size_type)puVar5;
  __l._M_array = pdVar4;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)rr.rhs_,__l,
             (allocator_type *)in_stack_fffffffffffffb18);
  local_2ac = local_1d0;
  local_2a8 = (_Bit_pointer)&local_2ac;
  local_2a0 = (_Bit_type *)0x1;
  this_01 = (AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_> *)(local_380 + 0xd3);
  std::allocator<int>::allocator((allocator<int> *)0x244e2c);
  __l_00._M_len = (size_type)puVar5;
  __l_00._M_array = (iterator)pdVar4;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)rr.rhs_,__l_00,(allocator_type *)this_01);
  LinTerms::LinTerms(in_stack_fffffffffffffb60,
                     (vector<double,_std::allocator<double>_> *)
                     CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58),
                     (vector<int,_std::allocator<int>_> *)pCVar3);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffb00);
  std::allocator<int>::~allocator((allocator<int> *)0x244e89);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffb00);
  std::allocator<double>::~allocator((allocator<double> *)0x244ea3);
  LinTerms::LinTerms((LinTerms *)CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0),
                     &in_stack_fffffffffffffae8->super_LinTerms);
  pCVar3 = ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<-1>_>_>::
           GetConstraint((ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>_>
                          *)0x244ec5);
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<-1>_>::GetRhsOrRange(pCVar3);
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<-1>_>::AlgebraicConstraint
            (this_01,(LinTerms *)pCVar3,rr,(bool)fSort);
  ctx.value_ = (CtxVal)((ulong)pCVar3 >> 0x20);
  this_00 = (FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
             *)local_380;
  ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<-1>_>_>::
  ConditionalConstraint(in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<-1>_>::~AlgebraicConstraint
            ((AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_> *)
             CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0));
  LinTerms::~LinTerms((LinTerms *)CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0));
  var = (int)((ulong)(in_RDI + -0x208) >> 0x20);
  FunctionalConstraint::GetResultVar((FunctionalConstraint *)local_10._M_allocated_capacity);
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
  ::
  RedefineVariable<mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRhs<_1>>>>
            (in_stack_fffffffffffffc40,in_stack_fffffffffffffc3c,in_stack_fffffffffffffc30);
  iVar2 = FunctionalConstraint::GetResultVar((FunctionalConstraint *)local_10._M_allocated_capacity)
  ;
  FunctionalConstraint::GetContext((FunctionalConstraint *)local_10._M_allocated_capacity);
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  ::PropagateResultOfInitExpr(this_00,var,ctx);
  ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<-1>_>_>::
  ~ConditionalConstraint
            ((ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>_> *)
             0x244fb5);
  LinTerms::~LinTerms((LinTerms *)CONCAT44(iVar2,in_stack_fffffffffffffaf0));
  LinearFunctionalConstraint::~LinearFunctionalConstraint
            ((LinearFunctionalConstraint *)CONCAT44(iVar2,in_stack_fffffffffffffaf0));
  pre::
  AutoLinkScope<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  ::~AutoLinkScope(in_stack_fffffffffffffbe0);
  return;
}

Assistant:

void ConvertConditionalConLHS(
      const ConditionalConstraint< AlgebraicConstraint<Body, RhsOrRange> >& con,
      int i) {
    auto alscope = MPD( MakeAutoLinker( con, i ) );       // link from \a con
    /// Create a functional constraint from the LHS
    auto fc = MakeFunctionalConstraint(
        AlgebraicExpression{con.GetConstraint().GetArguments(), 0.0});
    auto resvar = MPD( AssignResultVar2Args(std::move(fc)) );
    if ( !MPCD(VarHasMarking(resvar) ))         // mark as expr if new
      MPD( MarkAsExpression(resvar) );
    /// resvar can be a proper variable - ModelAPI should flexibly handle this
    LinTerms lt { {1.0}, {resvar} };
    ConditionalConstraint< AlgebraicConstraint<LinTerms, RhsOrRange> >
        ccnew { { std::move(lt), con.GetConstraint().GetRhsOrRange() } };
    MPD( RedefineVariable(con.GetResultVar(), std::move(ccnew)) );  // Use new CondCon
    MPD( PropagateResultOfInitExpr(con.GetResultVar(), con.GetContext()) ); // context
  }